

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm-parse.cc
# Opt level: O0

uint compute_correct(map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *ref,map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *hyp,uint len)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  uint in_EDX;
  const_iterator hi;
  const_iterator ri;
  uint i;
  uint res;
  string *in_stack_ffffffffffffffa8;
  _Self local_50;
  _Self local_48;
  uint local_3c;
  _Self local_38;
  uint local_2c;
  _Self local_28;
  uint local_1c;
  uint local_18;
  uint local_14;
  
  local_18 = 0;
  local_1c = 0;
  local_14 = in_EDX;
  while( true ) {
    if (local_14 <= local_1c) {
      return local_18;
    }
    local_2c = local_1c;
    local_28._M_node =
         (_Base_ptr)
         std::
         map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_ffffffffffffffa8,(key_type *)0x155927);
    local_3c = local_1c;
    local_38._M_node =
         (_Base_ptr)
         std::
         map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_ffffffffffffffa8,(key_type *)0x155943);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(&local_28,&local_48);
    if (!bVar1) break;
    local_50._M_node =
         (_Base_ptr)
         std::
         map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(&local_38,&local_50);
    if (!bVar1) {
      __assert_fail("hi != hyp.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/clab[P]stack-lstm-ner/ner-system/lstm-parse.cc"
                    ,0x294,
                    "unsigned int compute_correct(const map<int, string> &, const map<int, string> &, unsigned int)"
                   );
    }
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x1559dc);
    in_stack_ffffffffffffffa8 = (string *)&ppVar3->second;
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1559ee);
    iVar2 = std::__cxx11::string::compare(in_stack_ffffffffffffffa8);
    if (iVar2 == 0) {
      local_18 = local_18 + 1;
    }
    local_1c = local_1c + 1;
  }
  __assert_fail("ri != ref.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/clab[P]stack-lstm-ner/ner-system/lstm-parse.cc"
                ,0x293,
                "unsigned int compute_correct(const map<int, string> &, const map<int, string> &, unsigned int)"
               );
}

Assistant:

unsigned compute_correct(const map<int,string>& ref, const map<int,string>& hyp, unsigned len) {
  unsigned res = 0;
  for (unsigned i = 0; i < len; ++i) {
    auto ri = ref.find(i);
    auto hi = hyp.find(i);
    assert(ri != ref.end());
    assert(hi != hyp.end());
    if (ri->second.compare(hi->second)==0) ++res;
  }
  return res;
}